

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5NextMethod(sqlite3_vtab_cursor *pCursor)

{
  sqlite3_vtab *psVar1;
  long lVar2;
  Fts5Expr *pExpr;
  Fts5ExprNode *pFVar3;
  sqlite3_module *psVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  
  iVar5 = *(int *)&pCursor[4].pVtab;
  if (iVar5 == 1) {
    if (*(int *)((long)&(pCursor->pVtab[1].pModule)->xUpdate + 4) == 0) goto LAB_001bdf17;
    psVar1 = pCursor[8].pVtab;
    uVar8 = *(uint *)((long)&psVar1[1].pModule + 4);
    uVar10 = 0;
    uVar9 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar9 = uVar10;
    }
    for (; uVar10 != uVar9; uVar10 = uVar10 + 1) {
      for (lVar11 = *(long *)(*(long *)&psVar1[1].nRef + uVar10 * 8) + 0x20; lVar11 != 0;
          lVar11 = *(long *)(lVar11 + 0x20)) {
        lVar2 = *(long *)(lVar11 + 0x18);
        if (((lVar2 != 0) && (*(long *)(lVar2 + 0x18) != 0)) &&
           ((*(int *)(lVar2 + 0x48) == 0 || (*(int *)(**(long **)(lVar2 + 0x20) + 0x74) != 0)))) {
          *(undefined4 *)(*(long *)(lVar2 + 0x18) + 4) = 0;
        }
      }
    }
  }
  if (2 < iVar5) {
    if (iVar5 == 4) {
      iVar5 = fts5SorterNext((Fts5Cursor *)pCursor);
      return iVar5;
    }
    if (iVar5 == 3) {
      *(byte *)&pCursor[10].pVtab = *(byte *)&pCursor[10].pVtab | 1;
    }
    else {
      psVar4 = pCursor->pVtab[1].pModule;
      *(int *)&psVar4->xShadowName = *(int *)&psVar4->xShadowName + 1;
      iVar5 = sqlite3_step((sqlite3_stmt *)pCursor[7].pVtab);
      *(int *)&psVar4->xShadowName = *(int *)&psVar4->xShadowName + -1;
      if (iVar5 == 100) {
        *(uint *)&pCursor[10].pVtab = *(uint *)&pCursor[10].pVtab | 4;
      }
      else {
        *(uint *)&pCursor[10].pVtab = *(uint *)&pCursor[10].pVtab | 1;
        iVar5 = sqlite3_reset((sqlite3_stmt *)pCursor[7].pVtab);
        if (iVar5 != 0) {
          pcVar7 = sqlite3_errmsg(*(sqlite3 **)psVar4);
          pcVar7 = sqlite3_mprintf("%s",pcVar7);
          pCursor->pVtab->zErrMsg = pcVar7;
          return iVar5;
        }
      }
    }
    return 0;
  }
LAB_001bdf17:
  bVar12 = false;
  iVar5 = 0;
  if (((ulong)pCursor[10].pVtab & 0x20) != 0) {
    lVar11 = ((Fts5Expr *)pCursor[8].pVtab)->pRoot->iRowid;
    iVar5 = sqlite3Fts5ExprFirst
                      ((Fts5Expr *)pCursor[8].pVtab,*(Fts5Index **)&pCursor->pVtab[1].nRef,lVar11,
                       *(int *)((long)&pCursor[4].pVtab + 4));
    bVar12 = false;
    pcVar7 = (pCursor[8].pVtab)->zErrMsg;
    if (iVar5 == 0) {
      bVar12 = lVar11 != *(long *)(pcVar7 + 0x18);
    }
    uVar8 = *(uint *)&pCursor[10].pVtab & 0xffffff91;
    *(uint *)&pCursor[10].pVtab = uVar8 + 0x4e;
    if (*(int *)(pcVar7 + 4) != 0) {
      *(uint *)&pCursor[10].pVtab = uVar8 | 0x4f;
      return iVar5;
    }
  }
  if (!bVar12 && iVar5 == 0) {
    psVar1 = pCursor[6].pVtab;
    pExpr = (Fts5Expr *)pCursor[8].pVtab;
    pFVar3 = pExpr->pRoot;
    do {
      iVar5 = (*pFVar3->xNext)(pExpr,pFVar3,0,0);
    } while (pFVar3->bNomatch != 0);
    iVar6 = fts5RowidCmp(pExpr,pFVar3->iRowid,(i64)psVar1);
    if (0 < iVar6) {
      pFVar3->bEof = 1;
    }
    *(uint *)&pCursor[10].pVtab =
         *(uint *)((pCursor[8].pVtab)->zErrMsg + 4) | *(uint *)&pCursor[10].pVtab | 0x4e;
  }
  return iVar5;
}

Assistant:

static int fts5NextMethod(sqlite3_vtab_cursor *pCursor){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCursor;
  int rc;

  assert( (pCsr->ePlan<3)==
          (pCsr->ePlan==FTS5_PLAN_MATCH || pCsr->ePlan==FTS5_PLAN_SOURCE)
  );
  assert( !CsrFlagTest(pCsr, FTS5CSR_EOF) );

  /* If this cursor uses FTS5_PLAN_MATCH and this is a tokendata=1 table,
  ** clear any token mappings accumulated at the fts5_index.c level. In
  ** other cases, specifically FTS5_PLAN_SOURCE and FTS5_PLAN_SORTED_MATCH,
  ** we need to retain the mappings for the entire query.  */
  if( pCsr->ePlan==FTS5_PLAN_MATCH
   && ((Fts5Table*)pCursor->pVtab)->pConfig->bTokendata
  ){
    sqlite3Fts5ExprClearTokens(pCsr->pExpr);
  }

  if( pCsr->ePlan<3 ){
    int bSkip = 0;
    if( (rc = fts5CursorReseek(pCsr, &bSkip)) || bSkip ) return rc;
    rc = sqlite3Fts5ExprNext(pCsr->pExpr, pCsr->iLastRowid);
    CsrFlagSet(pCsr, sqlite3Fts5ExprEof(pCsr->pExpr));
    fts5CsrNewrow(pCsr);
  }else{
    switch( pCsr->ePlan ){
      case FTS5_PLAN_SPECIAL: {
        CsrFlagSet(pCsr, FTS5CSR_EOF);
        rc = SQLITE_OK;
        break;
      }

      case FTS5_PLAN_SORTED_MATCH: {
        rc = fts5SorterNext(pCsr);
        break;
      }

      default: {
        Fts5Config *pConfig = ((Fts5Table*)pCursor->pVtab)->pConfig;
        pConfig->bLock++;
        rc = sqlite3_step(pCsr->pStmt);
        pConfig->bLock--;
        if( rc!=SQLITE_ROW ){
          CsrFlagSet(pCsr, FTS5CSR_EOF);
          rc = sqlite3_reset(pCsr->pStmt);
          if( rc!=SQLITE_OK ){
            pCursor->pVtab->zErrMsg = sqlite3_mprintf(
                "%s", sqlite3_errmsg(pConfig->db)
            );
          }
        }else{
          rc = SQLITE_OK;
          CsrFlagSet(pCsr, FTS5CSR_REQUIRE_DOCSIZE);
        }
        break;
      }
    }
  }

  return rc;
}